

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O1

void fill_inverse_cmap(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize,int c0,int c1,int c2
                      )

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uchar **ppuVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  uchar *puVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  byte *pbVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  uint uVar29;
  int *piVar30;
  uint uVar31;
  byte *pbVar32;
  bool bVar33;
  uchar colorlist [256];
  int mindist [256];
  byte local_5b8 [128];
  byte abStack_538 [256];
  int local_438 [258];
  
  uVar15 = (uint)cquantize * 8;
  uVar13 = uVar15 & 0xffffffe0;
  uVar1 = uVar13 + 4;
  uVar10 = c0 * 4 & 0xffffffe0;
  uVar2 = uVar10 + 2;
  uVar7 = c1 * 8 & 0xffffffe0;
  uVar3 = uVar7 + 4;
  iVar5 = oim->colorsTotal;
  lVar27 = (long)iVar5;
  if (lVar27 < 1) {
    iVar9 = 0x7fffffff;
  }
  else {
    uVar15 = uVar15 | 0x1c;
    uVar29 = c0 * 4 | 0x1e;
    uVar31 = c1 * 8 | 0x1c;
    iVar9 = 0x7fffffff;
    lVar17 = 0;
    do {
      iVar18 = oim->red[lVar17];
      uVar8 = uVar15;
      if (iVar18 < (int)uVar1) {
        iVar11 = (iVar18 - uVar1) * 2;
        iVar11 = iVar11 * iVar11;
      }
      else if (iVar18 - uVar15 == 0 || iVar18 < (int)uVar15) {
        if ((int)(uVar13 + uVar15 + 4) >> 1 < iVar18) {
          uVar8 = uVar1;
        }
        iVar11 = 0;
      }
      else {
        iVar11 = (iVar18 - uVar15) * 2;
        iVar11 = iVar11 * iVar11;
        uVar8 = uVar1;
      }
      iVar22 = oim->green[lVar17];
      uVar23 = uVar29;
      if (iVar22 < (int)uVar2) {
        iVar26 = (iVar22 - uVar2) * 3;
        iVar11 = iVar11 + iVar26 * iVar26;
      }
      else if (iVar22 - uVar29 == 0 || iVar22 < (int)uVar29) {
        if ((int)(uVar10 + uVar29 + 2) >> 1 < iVar22) {
          uVar23 = uVar2;
        }
      }
      else {
        iVar26 = (iVar22 - uVar29) * 3;
        iVar11 = iVar11 + iVar26 * iVar26;
        uVar23 = uVar2;
      }
      iVar26 = oim->blue[lVar17];
      uVar24 = uVar31;
      if (iVar26 < (int)uVar3) {
        iVar11 = iVar11 + (iVar26 - uVar3) * (iVar26 - uVar3);
      }
      else {
        iVar28 = iVar26 - uVar31;
        if (iVar28 == 0 || iVar26 < (int)uVar31) {
          if ((int)(uVar7 + uVar31 + 4) >> 1 < iVar26) {
            uVar24 = uVar3;
          }
        }
        else {
          iVar11 = iVar11 + iVar28 * iVar28;
          uVar24 = uVar3;
        }
      }
      iVar28 = (iVar18 - uVar8) * 2;
      iVar18 = (iVar22 - uVar23) * 3;
      iVar18 = (iVar26 - uVar24) * (iVar26 - uVar24) + iVar18 * iVar18 + iVar28 * iVar28;
      if (iVar9 <= iVar18) {
        iVar18 = iVar9;
      }
      iVar9 = iVar18;
      local_438[lVar17] = iVar11;
      lVar17 = lVar17 + 1;
    } while (lVar27 != lVar17);
  }
  if (iVar5 < 1) {
    uVar7 = 0;
  }
  else {
    lVar17 = 0;
    uVar7 = 0;
    do {
      if (local_438[lVar17] <= iVar9) {
        lVar14 = (long)(int)uVar7;
        uVar7 = uVar7 + 1;
        abStack_538[lVar14] = (byte)lVar17;
      }
      lVar17 = lVar17 + 1;
    } while (lVar27 != lVar17);
  }
  ppuVar6 = nim->pixels;
  lVar27 = 0;
  do {
    local_438[lVar27] = 0x7fffffff;
    lVar27 = lVar27 + 1;
  } while ((int)lVar27 != 0x80);
  if (0 < (int)uVar7) {
    uVar20 = 0;
    do {
      bVar4 = abStack_538[uVar20];
      iVar5 = oim->blue[bVar4];
      iVar22 = uVar1 - oim->red[bVar4];
      iVar18 = iVar22 * 2;
      iVar11 = uVar2 - oim->green[bVar4];
      iVar9 = iVar11 * 3;
      iVar26 = uVar3 - iVar5;
      iVar26 = iVar26 * iVar26 + iVar9 * iVar9 + iVar18 * iVar18;
      iVar18 = iVar22 * 0x40 + 0x100;
      iVar9 = 3;
      pbVar32 = local_5b8;
      piVar30 = local_438;
      do {
        iVar12 = 7;
        iVar28 = iVar11 * 0x48 + 0x90;
        iVar22 = iVar26;
        do {
          iVar19 = 0;
          iVar16 = iVar22;
          do {
            if (iVar16 < *piVar30) {
              *piVar30 = iVar16;
              *pbVar32 = bVar4;
            }
            iVar16 = iVar16 + ((c1 & 0xfffffffcU) << 7 | 0x80) + iVar5 * -0x10 + iVar19;
            piVar30 = piVar30 + 1;
            pbVar32 = pbVar32 + 1;
            iVar19 = iVar19 + 0x80;
          } while (iVar19 != 0x200);
          iVar22 = iVar22 + iVar28;
          iVar28 = iVar28 + 0x120;
          bVar33 = iVar12 != 0;
          iVar12 = iVar12 + -1;
        } while (bVar33);
        iVar26 = iVar26 + iVar18;
        iVar18 = iVar18 + 0x200;
        bVar33 = iVar9 != 0;
        iVar9 = iVar9 + -1;
      } while (bVar33);
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar7);
  }
  pbVar32 = local_5b8;
  uVar20 = 0;
  do {
    puVar21 = ppuVar6[uVar20 | (long)(int)((uint)cquantize & 0xfffffffc)] +
              (long)(int)(c0 & 0xfffffff8) * 0x40 + (long)(int)(c1 & 0xfffffffc) * 2;
    lVar27 = 0;
    do {
      pbVar25 = pbVar32;
      lVar17 = 0;
      do {
        *(ushort *)(puVar21 + lVar17 * 2) = pbVar25[lVar17] + 1;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      lVar27 = lVar27 + 1;
      puVar21 = puVar21 + 0x40;
      pbVar32 = pbVar25 + 4;
    } while (lVar27 != 8);
    uVar20 = uVar20 + 1;
    pbVar32 = pbVar25 + 4;
  } while (uVar20 != 4);
  return;
}

Assistant:

LOCAL (void)
fill_inverse_cmap (
    gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize,
    int c0, int c1, int c2)
/* Fill the inverse-colormap entries in the update box that contains */
/* histogram cell c0/c1/c2.  (Only that one cell MUST be filled, but */
/* we can fill as many others as we wish.) */
{
	hist3d histogram = cquantize->histogram;
	int minc0, minc1, minc2;	/* lower left corner of update box */
	int ic0, ic1, ic2;
	register JSAMPLE *cptr;	/* pointer into bestcolor[] array */
	register histptr cachep;	/* pointer into main cache array */
	/* This array lists the candidate colormap indexes. */
	JSAMPLE colorlist[MAXNUMCOLORS];
	int numcolors;		/* number of candidate colors */
	/* This array holds the actually closest colormap index for each cell. */
	JSAMPLE bestcolor[BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS];

	/* Convert cell coordinates to update box ID */
	c0 >>= BOX_C0_LOG;
	c1 >>= BOX_C1_LOG;
	c2 >>= BOX_C2_LOG;

	/* Compute true coordinates of update box's origin corner.
	 * Actually we compute the coordinates of the center of the corner
	 * histogram cell, which are the lower bounds of the volume we care about.
	 */
	minc0 = (c0 << BOX_C0_SHIFT) + ((1 << C0_SHIFT) >> 1);
	minc1 = (c1 << BOX_C1_SHIFT) + ((1 << C1_SHIFT) >> 1);
	minc2 = (c2 << BOX_C2_SHIFT) + ((1 << C2_SHIFT) >> 1);

	/* Determine which colormap entries are close enough to be candidates
	 * for the nearest entry to some cell in the update box.
	 */
	numcolors =
	    find_nearby_colors (oim, nim, cquantize, minc0, minc1, minc2, colorlist);
	find_best_colors (oim, nim, cquantize, minc0, minc1, minc2, numcolors,
			  colorlist, bestcolor);

	/* Save the best color numbers (plus 1) in the main cache array */
	c0 <<= BOX_C0_LOG;		/* convert ID back to base cell indexes */
	c1 <<= BOX_C1_LOG;
	c2 <<= BOX_C2_LOG;
	cptr = bestcolor;
	for (ic0 = 0; ic0 < BOX_C0_ELEMS; ic0++) {
		for (ic1 = 0; ic1 < BOX_C1_ELEMS; ic1++) {
			cachep = &histogram[c0 + ic0][c1 + ic1][c2];
			for (ic2 = 0; ic2 < BOX_C2_ELEMS; ic2++) {
				*cachep++ = (histcell) ((*cptr++) + 1);
			}
		}
	}
}